

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintSExpression::visitElementSegment(PrintSExpression *this,ElementSegment *curr)

{
  Expression *curr_00;
  bool bVar1;
  Index IVar2;
  size_type sVar3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar4;
  reference ppEVar5;
  RefFunc *pRVar6;
  ostream *poVar7;
  Expression *entry_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range2_1;
  RefFunc *refFunc;
  Expression *entry;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range2;
  Measurer local_138;
  byte local_49;
  undefined1 auStack_48 [7];
  bool needExplicitOffset;
  undefined1 local_38 [8];
  anon_class_24_3_2843ac0c printElemType;
  undefined1 auStack_18 [7];
  bool usesExpressions;
  ElementSegment *curr_local;
  PrintSExpression *this_local;
  
  _auStack_18 = curr;
  curr_local = (ElementSegment *)this;
  printElemType.curr._7_1_ = TableUtils::usesExpressions(curr,this->currModule);
  local_38 = (undefined1  [8])((long)&printElemType.curr + 7);
  printElemType.this = (PrintSExpression *)auStack_18;
  printElemType.usesExpressions = (bool *)this;
  doIndent(this->o,this->indent);
  std::operator<<(this->o,'(');
  poVar7 = this->o;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_48,"elem ");
  printMedium(poVar7,_auStack_48);
  wasm::Name::print((Name *)_auStack_18,this->o);
  bVar1 = IString::is(&(_auStack_18->table).super_IString);
  if (bVar1) {
    if (((printElemType.curr._7_1_ & 1) != 0) ||
       (sVar3 = std::
                vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ::size(&this->currModule->tables), 1 < sVar3)) {
      std::operator<<(this->o," (table ");
      wasm::Name::print(&_auStack_18->table,this->o);
      std::operator<<(this->o,")");
    }
    std::operator<<(this->o,' ');
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.
    flexible.
    super__Vector_base<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.currFunction
         = (Function *)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.
    flexible.
    super__Vector_base<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.
    flexible.
    super__Vector_base<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[9].func = (TaskFunc)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[9].currp = (Expression **)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[8].func = (TaskFunc)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[8].currp = (Expression **)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[7].func = (TaskFunc)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[7].currp = (Expression **)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[6].func = (TaskFunc)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[6].currp = (Expression **)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[5].func = (TaskFunc)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[5].currp = (Expression **)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[4].func = (TaskFunc)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[4].currp = (Expression **)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[3].func = (TaskFunc)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[3].currp = (Expression **)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[2].func = (TaskFunc)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[2].currp = (Expression **)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[1].func = (TaskFunc)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[1].currp = (Expression **)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[0].func = (TaskFunc)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
    _M_elems[0].currp = (Expression **)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.replacep =
         (Expression **)0x0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.
    usedFixed = 0;
    local_138.
    super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
    super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.currModule =
         (Module *)0x0;
    Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Walker
              ((Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_> *)
               &local_138);
    local_138.size = 0;
    IVar2 = Measurer::measure(_auStack_18->offset);
    bVar1 = 1 < IVar2;
    Measurer::~Measurer(&local_138);
    local_49 = bVar1;
    if (bVar1) {
      std::operator<<(this->o,"(offset ");
    }
    visit(this,_auStack_18->offset);
    if ((local_49 & 1) != 0) {
      std::operator<<(this->o,')');
    }
    if (((printElemType.curr._7_1_ & 1) != 0) ||
       (sVar3 = std::
                vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ::size(&this->currModule->tables), 1 < sVar3)) {
      std::operator<<(this->o,' ');
      visitElementSegment::anon_class_24_3_2843ac0c::operator()
                ((anon_class_24_3_2843ac0c *)local_38);
    }
  }
  else {
    std::operator<<(this->o,' ');
    visitElementSegment::anon_class_24_3_2843ac0c::operator()((anon_class_24_3_2843ac0c *)local_38);
  }
  if ((printElemType.curr._7_1_ & 1) == 0) {
    pvVar4 = &_auStack_18->data;
    __end2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin(pvVar4);
    entry = (Expression *)
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                       *)&entry), bVar1) {
      ppEVar5 = __gnu_cxx::
                __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                ::operator*(&__end2);
      pRVar6 = Expression::cast<wasm::RefFunc>(*ppEVar5);
      std::operator<<(this->o,' ');
      wasm::Name::print(&pRVar6->func,this->o);
      __gnu_cxx::
      __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    pvVar4 = &_auStack_18->data;
    __end2_1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin(pvVar4);
    entry_1 = (Expression *)
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                               *)&entry_1), bVar1) {
      ppEVar5 = __gnu_cxx::
                __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                ::operator*(&__end2_1);
      curr_00 = *ppEVar5;
      std::operator<<(this->o," (item ");
      visit(this,curr_00);
      std::operator<<(this->o,')');
      __gnu_cxx::
      __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      ::operator++(&__end2_1);
    }
  }
  poVar7 = std::operator<<(this->o,')');
  std::operator<<(poVar7,this->maybeNewLine);
  return;
}

Assistant:

void PrintSExpression::visitElementSegment(ElementSegment* curr) {
  bool usesExpressions = TableUtils::usesExpressions(curr, currModule);
  auto printElemType = [&]() {
    if (!usesExpressions) {
      o << "func";
    } else {
      printType(curr->type);
    }
  };

  doIndent(o, indent);
  o << '(';
  printMedium(o, "elem ");
  curr->name.print(o);

  if (curr->table.is()) {
    if (usesExpressions || currModule->tables.size() > 1) {
      // tableuse
      o << " (table ";
      curr->table.print(o);
      o << ")";
    }

    o << ' ';
    bool needExplicitOffset = Measurer{}.measure(curr->offset) > 1;
    if (needExplicitOffset) {
      o << "(offset ";
    }
    visit(curr->offset);
    if (needExplicitOffset) {
      o << ')';
    }

    if (usesExpressions || currModule->tables.size() > 1) {
      o << ' ';
      printElemType();
    }
  } else {
    o << ' ';
    printElemType();
  }

  if (!usesExpressions) {
    for (auto* entry : curr->data) {
      auto* refFunc = entry->cast<RefFunc>();
      o << ' ';
      refFunc->func.print(o);
    }
  } else {
    for (auto* entry : curr->data) {
      o << " (item ";
      visit(entry);
      o << ')';
    }
  }
  o << ')' << maybeNewLine;
}